

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O3

char * __thiscall Imf_3_2::anon_unknown_0::PtrIStream::readMemoryMapped(PtrIStream *this,int n)

{
  char *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  InputExc *this_00;
  stringstream _iex_throw_s;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  pcVar2 = this->current;
  pcVar1 = pcVar2 + n;
  if (pcVar1 <= this->end) {
    this->current = pcVar1;
    return pcVar2;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Early end of file: requesting ",0x1e);
  poVar3 = std::ostream::_M_insert<long>((long)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," extra bytes after file\n",0x18);
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::InputExc::InputExc(this_00,local_1a0);
  __cxa_throw(this_00,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
}

Assistant:

virtual char* readMemoryMapped (int n)
    {

        if (n + current > end)
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "Early end of file: requesting "
                    << end - (n + current) << " extra bytes after file\n");
        }
        const char* value = current;
        current += n;

        return const_cast<char*> (value);
    }